

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::Exp::backward_impl
          (Exp *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int iVar17;
  uint uVar18;
  Index size;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar19;
  
  uVar19 = (ulong)(dEdf->d).nd;
  iVar17 = 1;
  iVar20 = 1;
  if (uVar19 != 0) {
    uVar22 = 0;
    do {
      iVar20 = iVar20 * (dEdf->d).d[uVar22];
      uVar22 = uVar22 + 1;
    } while (uVar19 != uVar22);
  }
  uVar21 = iVar20 * (dEdf->d).bd;
  uVar19 = (ulong)(fx->d).nd;
  if (uVar19 != 0) {
    iVar17 = 1;
    uVar22 = 0;
    do {
      iVar17 = iVar17 * (fx->d).d[uVar22];
      uVar22 = uVar22 + 1;
    } while (uVar19 != uVar22);
  }
  if (uVar21 == iVar17 * (fx->d).bd) {
    uVar19 = (ulong)(dEdxi->d).nd;
    iVar17 = 1;
    if (uVar19 != 0) {
      uVar22 = 0;
      do {
        iVar17 = iVar17 * (dEdxi->d).d[uVar22];
        uVar22 = uVar22 + 1;
      } while (uVar19 != uVar22);
    }
    uVar18 = iVar17 * (dEdxi->d).bd;
    uVar19 = (ulong)uVar18;
    if (uVar18 == uVar21) {
      pfVar5 = dEdxi->v;
      uVar22 = uVar19;
      if ((((ulong)pfVar5 & 3) == 0) &&
         (uVar22 = (ulong)(-((uint)((ulong)pfVar5 >> 2) & 0x3fffffff) & 3), uVar19 <= uVar22)) {
        uVar22 = uVar19;
      }
      pfVar6 = dEdf->v;
      pfVar7 = fx->v;
      uVar24 = uVar19 - uVar22;
      uVar23 = uVar24 + 3;
      if (-1 < (long)uVar24) {
        uVar23 = uVar24;
      }
      if (uVar22 != 0) {
        uVar25 = 0;
        do {
          pfVar5[uVar25] = pfVar6[uVar25] * pfVar7[uVar25] + pfVar5[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar22 != uVar25);
      }
      uVar23 = (uVar23 & 0xfffffffffffffffc) + uVar22;
      if (3 < (long)uVar24) {
        do {
          pfVar1 = pfVar6 + uVar22;
          fVar8 = pfVar1[1];
          fVar9 = pfVar1[2];
          fVar10 = pfVar1[3];
          pfVar2 = pfVar7 + uVar22;
          fVar11 = pfVar2[1];
          fVar12 = pfVar2[2];
          fVar13 = pfVar2[3];
          pfVar3 = pfVar5 + uVar22;
          fVar14 = pfVar3[1];
          fVar15 = pfVar3[2];
          fVar16 = pfVar3[3];
          pfVar4 = pfVar5 + uVar22;
          *pfVar4 = *pfVar2 * *pfVar1 + *pfVar3;
          pfVar4[1] = fVar11 * fVar8 + fVar14;
          pfVar4[2] = fVar12 * fVar9 + fVar15;
          pfVar4[3] = fVar13 * fVar10 + fVar16;
          uVar22 = uVar22 + 4;
        } while ((long)uVar22 < (long)uVar23);
      }
      if ((long)uVar23 < (long)uVar19) {
        do {
          pfVar5[uVar23] = pfVar6[uVar23] * pfVar7[uVar23] + pfVar5[uVar23];
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      return;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void Exp::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Exp not yet implemented for CUDA");
#else
  dEdxi.vec() += dEdf.vec().cwiseProduct(fx.vec());
#endif
}